

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O3

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key,
          uint64_t val)

{
  pointer puVar1;
  pointer puVar2;
  uint64_t uVar3;
  byte bVar4;
  bool bVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong slot_id;
  ulong uVar12;
  set_mapper mapper;
  uint64_t empty_id;
  uint64_t local_c8;
  undefined1 local_c0 [32];
  pointer puStack_a0;
  pointer local_98;
  uint64_t local_90;
  uint64_t uStack_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t uStack_70;
  size_p2 sStack_68;
  size_p2 sStack_58;
  size_p2 sStack_48;
  uint64_t uStack_38;
  uint64_t uStack_30;
  
  if (this->max_size_ <= this->size_) {
    compact_hash_table((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                       local_c0,(this->univ_size_).bits_,(this->capa_size_).bits_ + 1);
    compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>::
    clone<poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>::set_mapper>
              ((compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher> *)this,
               (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)local_c0,
               (set_mapper *)&local_c8);
    (this->hasher_).univ_size_.mask_ = local_c0._16_8_;
    *(undefined8 *)&this->hasher_ = local_c0._0_8_;
    *(undefined8 *)&(this->hasher_).univ_size_ = local_c0._8_8_;
    puVar1 = (this->table_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->table_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)local_c0._24_8_;
    (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puStack_a0;
    register0x00001200 = ZEXT816(0) << 0x20;
    (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = local_98;
    local_98 = (pointer)0x0;
    if (puVar1 == (pointer)0x0) {
      (this->table_).width_ = local_80;
      (this->table_).size_ = local_90;
      (this->table_).mask_ = uStack_88;
      (this->univ_size_).bits_ = sStack_68.bits_;
      *(undefined4 *)&(this->univ_size_).field_0x4 = sStack_68._4_4_;
      (this->univ_size_).mask_ = sStack_68.mask_;
      (this->capa_size_).bits_ = sStack_58.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
      (this->capa_size_).mask_ = sStack_58.mask_;
      (this->quo_size_).bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->quo_size_).field_0x4 = sStack_48._4_4_;
      (this->quo_size_).mask_ = sStack_48.mask_;
      this->quo_shift_ = uStack_38;
      this->quo_invmask_ = uStack_30;
      this->size_ = local_78;
      this->max_size_ = uStack_70;
      (this->univ_size_).bits_ = sStack_68.bits_;
      *(undefined4 *)&(this->univ_size_).field_0x4 = sStack_68._4_4_;
      (this->univ_size_).mask_ = sStack_68.mask_;
      (this->capa_size_).bits_ = sStack_58.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
      (this->capa_size_).mask_ = sStack_58.mask_;
      (this->quo_size_).bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->quo_size_).field_0x4 = sStack_48._4_4_;
      (this->quo_size_).mask_ = sStack_48.mask_;
    }
    else {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      (this->table_).width_ = local_80;
      (this->table_).size_ = local_90;
      (this->table_).mask_ = uStack_88;
      (this->univ_size_).bits_ = sStack_68.bits_;
      *(undefined4 *)&(this->univ_size_).field_0x4 = sStack_68._4_4_;
      (this->univ_size_).mask_ = sStack_68.mask_;
      (this->capa_size_).bits_ = sStack_58.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
      (this->capa_size_).mask_ = sStack_58.mask_;
      (this->quo_size_).bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->quo_size_).field_0x4 = sStack_48._4_4_;
      (this->quo_size_).mask_ = sStack_48.mask_;
      this->quo_shift_ = uStack_38;
      this->quo_invmask_ = uStack_30;
      this->size_ = local_78;
      this->max_size_ = uStack_70;
      (this->univ_size_).bits_ = sStack_68.bits_;
      *(undefined4 *)&(this->univ_size_).field_0x4 = sStack_68._4_4_;
      (this->univ_size_).mask_ = sStack_68.mask_;
      (this->capa_size_).bits_ = sStack_58.bits_;
      *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
      (this->capa_size_).mask_ = sStack_58.mask_;
      (this->quo_size_).bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->quo_size_).field_0x4 = sStack_48._4_4_;
      (this->quo_size_).mask_ = sStack_48.mask_;
      if ((pointer)local_c0._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_c0._24_8_,(long)local_98 - local_c0._24_8_);
      }
    }
  }
  uVar6 = bijective_hash::split_mix_hasher::hash(&this->hasher_,key);
  uVar3 = (this->table_).width_;
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  slot_id = (this->capa_size_).mask_ & uVar6;
  uVar7 = uVar3 * slot_id;
  uVar8 = (ulong)((uint)uVar7 & 0x3f);
  uVar12 = puVar1[uVar7 >> 6];
  if (uVar3 + uVar8 < 0x41) {
    uVar10 = (uint)(uVar12 >> uVar8);
  }
  else {
    bVar4 = (byte)uVar7 & 0x3f;
    uVar10 = (uint)(uVar12 >> bVar4) | (uint)(puVar1[(uVar7 >> 6) + 1] << 0x40 - bVar4);
  }
  uVar12 = uVar6 >> ((ulong)(byte)(this->capa_size_).bits_ & 0x3f);
  if ((~(uVar10 & (uint)(this->table_).mask_) & 0x1fc) == 0) {
    compact_vector::set(&this->table_,slot_id,
                        val << 2 | uVar12 << ((ulong)(byte)this->quo_shift_ & 0x3f) | 3);
  }
  else {
    local_c0._0_8_ = 0;
    local_c8 = find_ass_cbit_(this,slot_id,(uint64_t *)local_c0);
    uVar3 = (this->table_).width_;
    puVar1 = (this->table_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = uVar3 * slot_id;
    uVar8 = (ulong)((uint)uVar7 & 0x3f);
    if (uVar8 + uVar3 < 0x41) {
      uVar10 = (uint)(puVar1[uVar7 >> 6] >> uVar8);
    }
    else {
      bVar4 = (byte)uVar7 & 0x3f;
      uVar10 = (uint)(puVar1[uVar7 >> 6] >> bVar4) |
               (uint)(puVar1[(uVar7 >> 6) + 1] << 0x40 - bVar4);
    }
    uVar9 = (uint)(this->table_).mask_;
    if ((uVar9 & uVar10 & 2) == 0) {
      if (local_c8 != 0xffffffffffffffff) {
        uVar7 = (this->capa_size_).mask_;
        do {
          local_c8 = local_c8 + 1 & uVar7;
          uVar8 = local_c8 * uVar3;
          uVar11 = (ulong)((uint)uVar8 & 0x3f);
          if (uVar11 + uVar3 < 0x41) {
            uVar10 = (uint)(puVar1[uVar8 >> 6] >> uVar11);
          }
          else {
            bVar4 = (byte)uVar8 & 0x3f;
            uVar10 = (uint)(puVar1[uVar8 >> 6] >> bVar4) |
                     (uint)(puVar1[(uVar8 >> 6) + 1] << 0x40 - bVar4);
          }
        } while ((uVar9 & 1 & uVar10) == 0);
        uVar7 = local_c8 - 1 & uVar7;
        local_c8 = uVar7;
        for (; local_c0._0_8_ != uVar7; local_c0._0_8_ = copy_from_right_(this,local_c0._0_8_)) {
        }
      }
      set_vbit_(this,slot_id,true);
      bVar5 = true;
      uVar7 = local_c0._0_8_;
    }
    else {
      bVar5 = find_item_(this,&local_c8,uVar12);
      if (bVar5) {
        set_val_(this,local_c8,val);
        return false;
      }
      uVar7 = local_c8 - 1 & (this->capa_size_).mask_;
      local_c8 = uVar7;
      if (local_c0._0_8_ != uVar7) {
        do {
          uVar7 = copy_from_right_(this,local_c0._0_8_);
          local_c0._0_8_ = uVar7;
        } while (uVar7 != local_c8);
      }
      bVar5 = false;
    }
    set_cbit_(this,uVar7,bVar5);
    set_quo_(this,local_c0._0_8_,uVar12);
    set_val_(this,local_c0._0_8_,val);
  }
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        assert(key < univ_size_.size());
        assert(val < val_mask);

        if (max_size_ <= size_) {
            // expand
            this_type new_cht{univ_size_.bits(), capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
            new_cht.num_resize_ = num_resize_ + 1;
#endif
            clone(new_cht);
            *this = std::move(new_cht);
        }

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (is_vacant_(mod)) {
            // without collision
            update_slot_(mod, quo, val, true, true);
            ++size_;
            return true;
        }

        uint64_t empty_id = 0;
        uint64_t slot_id = find_ass_cbit_(mod, empty_id);

        if (!get_vbit_(mod)) {  // initial insertion in the group
            // create a new collision group
            if (slot_id != UINT64_MAX) {  // require to displace existing groups?
                do {
                    slot_id = right_(slot_id);
                } while (!get_cbit_(slot_id));

                slot_id = left_(slot_id);  // rightmost slot of the group

                while (empty_id != slot_id) {
                    empty_id = copy_from_right_(empty_id);
                }
            } else {
                // not inside other collision groups
            }
            set_vbit_(mod, true);
            set_cbit_(empty_id, true);
        } else {
            // collision group already exists
            if (find_item_(slot_id, quo)) {  // already registered?
                set_val_(slot_id, val);  // update
                return false;
            }

            slot_id = left_(slot_id);  // rightmost of the group

            // displace existing groups for creating an empty slot
            while (empty_id != slot_id) {
                empty_id = copy_from_right_(empty_id);
            }
            set_cbit_(empty_id, false);
        }

        set_quo_(empty_id, quo);
        set_val_(empty_id, val);

        ++size_;

        return true;
    }